

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O1

var __thiscall cs::runtime_type::parse_not(runtime_type *this,var *b)

{
  char *__s1;
  int iVar1;
  undefined4 extraout_var;
  undefined *puVar2;
  bool *pbVar3;
  runtime_error *this_00;
  any *in_RDX;
  string local_38;
  
  if (in_RDX->mDat == (proxy *)0x0) {
    puVar2 = &void::typeinfo;
  }
  else {
    iVar1 = (*in_RDX->mDat->data->_vptr_baseHolder[2])();
    puVar2 = (undefined *)CONCAT44(extraout_var,iVar1);
  }
  __s1 = *(char **)(puVar2 + 8);
  if (__s1 != std::ios_base::out) {
    if (*__s1 != '*') {
      iVar1 = strcmp(__s1,std::ios_base::out);
      if (iVar1 == 0) goto LAB_002698ee;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,"Unsupported operator operations(Not).","");
    runtime_error::runtime_error(this_00,&local_38);
    __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
  }
LAB_002698ee:
  pbVar3 = cs_impl::any::const_val<bool>(in_RDX);
  local_38._M_dataplus._M_p = (pointer)(CONCAT71(local_38._M_dataplus._M_p._1_7_,*pbVar3) ^ 1);
  cs_impl::any::any<bool>((any *)this,(bool *)&local_38);
  return (var)(proxy *)this;
}

Assistant:

var runtime_type::parse_not(const var &b)
	{
		if (b.type() == typeid(boolean))
			return boolean(!b.const_val<boolean>());
		else
			throw runtime_error("Unsupported operator operations(Not).");
	}